

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run-emitter-test-suite.c
# Opt level: O1

int get_line(FILE *input,char *line)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  void *__dest;
  void *pvVar5;
  char *__s;
  
  pcVar2 = fgets(line,0x3ff,(FILE *)input);
  if (pcVar2 == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    __s = (char *)0xa;
    pcVar2 = strchr(line,10);
    if (pcVar2 == (char *)0x0) {
      get_line_cold_1();
      pcVar2 = strchr(__s,(int)line);
      if (pcVar2 == (char *)0x0) {
        pvVar5 = (void *)0x0;
      }
      else {
        pcVar2 = pcVar2 + 1;
        pcVar3 = strchr(pcVar2,0x20);
        if (pcVar3 == (char *)0x0) {
          sVar4 = strlen(__s);
          pcVar3 = __s + sVar4;
        }
        memcpy(__dest,pcVar2,(long)pcVar3 - (long)pcVar2);
        *(undefined1 *)((long)__dest + ((long)pcVar3 - (long)pcVar2)) = 0;
        pvVar5 = __dest;
      }
      return (int)pvVar5;
    }
    *pcVar2 = '\0';
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int get_line(FILE * input, char *line)
{
    char *newline;

    if (!fgets(line, 1024 - 1, input))
        return 0;

    if ((newline = strchr(line, '\n')) == NULL) {
        fprintf(stderr, "Line too long: '%s'", line);
        abort();
    }
    *newline = '\0';

    return 1;
}